

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86.cpp
# Opt level: O3

int __thiscall
ncnn::LSTM_x86::forward_int8
          (LSTM_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int _h;
  int iVar1;
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  ulong uVar2;
  int *piVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined4 uVar12;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined4 uVar20;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar31;
  undefined1 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  uint uVar36;
  int _h_00;
  pointer pMVar37;
  size_t sVar38;
  void *in_R8;
  int iVar39;
  Mat local_458;
  Mat local_408;
  Mat m_6;
  Mat m_3;
  Mat local_318;
  Mat m_5;
  Option opt_quant;
  Mat m_2;
  Mat m_4;
  Mat m_1;
  Mat m_9;
  Mat m_8;
  Mat local_78;
  undefined4 uVar6;
  undefined3 uVar8;
  undefined2 uVar10;
  undefined4 uVar14;
  undefined3 uVar16;
  undefined2 uVar18;
  undefined4 uVar22;
  undefined3 uVar24;
  undefined2 uVar26;
  undefined3 uVar30;
  undefined2 uVar32;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  _h = bottom_blob->h;
  iVar1 = (this->super_LSTM).direction;
  local_408.cstep = 0;
  local_408.data = (void *)0x0;
  local_408.refcount._0_4_ = 0;
  local_408.refcount._4_4_ = 0;
  local_408.elemsize._0_4_ = 0;
  local_408.elemsize._4_4_ = 0;
  local_408.elempack = 0;
  local_408.allocator = (Allocator *)0x0;
  local_408.dims = 0;
  local_408.w = 0;
  local_408.h = 0;
  local_408.d = 0;
  local_408.c = 0;
  local_458.cstep = 0;
  local_458.data = (void *)0x0;
  local_458.refcount._0_4_ = 0;
  local_458.refcount._4_4_ = 0;
  local_458.elemsize._0_4_ = 0;
  local_458.elemsize._4_4_ = 0;
  local_458.elempack = 0;
  local_458.allocator = (Allocator *)0x0;
  local_458.dims = 0;
  local_458.w = 0;
  local_458.h = 0;
  local_458.d = 0;
  local_458.c = 0;
  _allocator = (&opt->blob_allocator)
               [(long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start != 0xd8];
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0xd8) {
    Mat::clone(&local_318,(__fn *)(bottom_blob + 1),_allocator,0xd8,in_R8);
    piVar3 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = (int *)CONCAT44(local_408.refcount._4_4_,local_408.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_408.allocator == (Allocator *)0x0) {
          if (local_408.data != (void *)0x0) {
            free(local_408.data);
          }
        }
        else {
          (*(local_408.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar3 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
    local_408.data = local_318.data;
    local_408.refcount._0_4_ = local_318.refcount._0_4_;
    local_408.refcount._4_4_ = local_318.refcount._4_4_;
    local_408.elemsize._0_4_ = (undefined4)local_318.elemsize;
    local_408.elemsize._4_4_ = local_318.elemsize._4_4_;
    local_408.elempack = local_318.elempack;
    local_408.allocator = local_318.allocator;
    local_408.dims = local_318.dims;
    local_408.w = local_318.w;
    local_408.h = local_318.h;
    uVar34._0_4_ = local_318.d;
    uVar34._4_4_ = local_318.c;
    local_408.d = local_318.d;
    local_408.c = local_318.c;
    local_408.cstep = local_318.cstep;
    sVar38 = local_318.cstep;
    uVar35 = uVar34;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      uVar35 = local_408._52_8_;
      if (*piVar3 == 0) {
        if (local_318.allocator == (Allocator *)0x0) {
          if (local_318.data != (void *)0x0) {
            local_408._52_8_ = uVar34;
            free(local_318.data);
            uVar35 = local_408._52_8_;
          }
        }
        else {
          local_408._52_8_ = uVar34;
          (*(local_318.allocator)->_vptr_Allocator[3])();
          uVar35 = local_408._52_8_;
        }
      }
    }
    local_408._52_8_ = uVar35;
    Mat::clone(&local_318,
               (__fn *)((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start + 2),_allocator,(int)sVar38,in_R8);
    piVar3 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = (int *)CONCAT44(local_458.refcount._4_4_,local_458.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_458.allocator == (Allocator *)0x0) {
          if (local_458.data != (void *)0x0) {
            free(local_458.data);
          }
        }
        else {
          (*(local_458.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar3 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
    local_458.data = local_318.data;
    local_458.refcount._0_4_ = local_318.refcount._0_4_;
    local_458.refcount._4_4_ = local_318.refcount._4_4_;
    local_458.elemsize._0_4_ = (undefined4)local_318.elemsize;
    local_458.elemsize._4_4_ = local_318.elemsize._4_4_;
    local_458.elempack = local_318.elempack;
    local_458.allocator = local_318.allocator;
    local_458.dims = local_318.dims;
    local_458.w = local_318.w;
    local_458.h = local_318.h;
    local_458.d = local_318.d;
    local_458.c = local_318.c;
    local_458.cstep = local_318.cstep;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_318.allocator == (Allocator *)0x0) {
          if (local_318.data != (void *)0x0) {
            free(local_318.data);
          }
        }
        else {
          (*(local_318.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    _h_00 = (iVar1 == 2) + 1;
    Mat::create(&local_408,(this->super_LSTM).num_output,_h_00,4,_allocator);
    iVar39 = -100;
    if ((local_408.data == (void *)0x0) || (local_408.cstep * (long)local_408.c == 0))
    goto LAB_0035e296;
    uVar36 = (int)local_408.cstep * local_408.c;
    if (0 < (int)uVar36) {
      memset(local_408.data,0,(ulong)uVar36 << 2);
    }
    Mat::create(&local_458,(this->super_LSTM).hidden_size,_h_00,4,_allocator);
    if ((local_458.data == (void *)0x0) || (local_458.cstep * (long)local_458.c == 0))
    goto LAB_0035e296;
    uVar36 = (int)local_458.cstep * local_458.c;
    if (0 < (int)uVar36) {
      memset(local_458.data,0,(ulong)uVar36 << 2);
    }
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,(this->super_LSTM).num_output << (iVar1 == 2),_h,4,opt->blob_allocator);
  iVar39 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    local_318.cstep = 0;
    local_318.data = (void *)0x0;
    local_318.refcount._0_4_ = 0;
    local_318.refcount._4_4_ = 0;
    local_318.elemsize._0_4_ = 0;
    local_318.elemsize._4_4_ = 0;
    local_318.elempack = 0;
    local_318.allocator = (Allocator *)0x0;
    local_318.dims = 0;
    local_318.w = 0;
    local_318.h = 0;
    local_318.d = 0;
    local_318.c = 0;
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    opt_quant.lightmode = opt->lightmode;
    opt_quant.use_shader_pack8 = opt->use_shader_pack8;
    opt_quant.use_subgroup_ops = opt->use_subgroup_ops;
    opt_quant.use_reserved_0 = opt->use_reserved_0;
    opt_quant.num_threads = opt->num_threads;
    uVar4 = opt->openmp_blocktime;
    uVar5 = opt->use_winograd_convolution;
    uVar7 = opt->use_sgemm_convolution;
    uVar9 = opt->use_int8_inference;
    uVar11 = opt->use_vulkan_compute;
    uVar10 = CONCAT11(uVar11,uVar9);
    uVar8 = CONCAT21(uVar10,uVar7);
    uVar6 = CONCAT31(uVar8,uVar5);
    uVar2._0_1_ = opt->use_bf16_storage;
    uVar2._1_1_ = opt->use_fp16_packed;
    uVar2._2_1_ = opt->use_fp16_storage;
    uVar2._3_1_ = opt->use_fp16_arithmetic;
    uVar2._4_1_ = opt->use_int8_packed;
    uVar2._5_1_ = opt->use_int8_storage;
    uVar2._6_1_ = opt->use_int8_arithmetic;
    uVar2._7_1_ = opt->use_packing_layout;
    uVar12 = opt->vulkan_device_index;
    uVar13 = opt->use_reserved_1;
    uVar15 = opt->use_image_storage;
    uVar17 = opt->use_tensor_storage;
    uVar19 = opt->use_reserved_2;
    uVar18 = CONCAT11(uVar19,uVar17);
    uVar16 = CONCAT21(uVar18,uVar15);
    uVar14 = CONCAT31(uVar16,uVar13);
    uVar20 = opt->flush_denormals;
    uVar21 = opt->use_local_pool_allocator;
    uVar23 = opt->use_shader_local_memory;
    uVar25 = opt->use_cooperative_matrix;
    uVar27 = opt->use_winograd23_convolution;
    uVar26 = CONCAT11(uVar27,uVar25);
    uVar24 = CONCAT21(uVar26,uVar23);
    uVar22 = CONCAT31(uVar24,uVar21);
    uVar35._0_1_ = opt->use_winograd43_convolution;
    uVar35._1_1_ = opt->use_winograd63_convolution;
    uVar35._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar35._3_1_ = opt->use_fp16_uniform;
    uVar28 = opt->use_int8_uniform;
    uVar29 = opt->use_reserved_9;
    uVar31 = opt->use_reserved_10;
    uVar33 = opt->use_reserved_11;
    uVar32 = CONCAT11(uVar33,uVar31);
    uVar30 = CONCAT21(uVar32,uVar29);
    uVar35._4_4_ = CONCAT31(uVar30,uVar28);
    opt_quant._56_4_ = SUB84(uVar35,0);
    opt_quant.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_quant.workspace_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_quant.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_quant.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_quant._32_8_ = uVar2 & 0xffffffffffffff;
    opt_quant.openmp_blocktime = uVar4;
    opt_quant._28_4_ = uVar6;
    opt_quant.vulkan_device_index = uVar12;
    opt_quant._44_4_ = uVar14;
    opt_quant.flush_denormals = uVar20;
    opt_quant._52_4_ = uVar22;
    opt_quant._60_4_ = uVar35._4_4_;
    lstm_dynamic_quantize(bottom_blob,&local_318,&local_78,&opt_quant);
    uVar36 = (this->super_LSTM).direction;
    if (uVar36 < 2) {
      opt_quant._44_4_ = (this->weight_data_tm).w;
      opt_quant.flush_denormals = (this->weight_data_tm).h;
      opt_quant._56_4_ = (this->weight_data_tm).d;
      opt_quant._0_8_ = (this->weight_data_tm).data;
      sVar38 = (this->weight_data_tm).elemsize;
      opt_quant.openmp_blocktime = (this->weight_data_tm).elempack;
      opt_quant._32_8_ = (this->weight_data_tm).allocator;
      opt_quant.blob_allocator._0_4_ = 0;
      opt_quant.blob_allocator._4_4_ = 0;
      opt_quant.workspace_allocator._0_4_ = (undefined4)sVar38;
      opt_quant.workspace_allocator._4_4_ = (undefined4)(sVar38 >> 0x20);
      opt_quant.use_local_pool_allocator = true;
      opt_quant.use_shader_local_memory = false;
      opt_quant.use_cooperative_matrix = false;
      opt_quant.use_winograd23_convolution = false;
      opt_quant.vulkan_device_index = (this->weight_data_tm).dims + -1;
      m_1.w = (this->weight_data_tm_int8_descales).w;
      m_1.h = (this->weight_data_tm_int8_descales).h;
      m_1.data = (this->weight_data_tm_int8_descales).data;
      uVar2 = (this->weight_data_tm_int8_descales).elemsize;
      m_1.elempack = (this->weight_data_tm_int8_descales).elempack;
      m_1.allocator = (this->weight_data_tm_int8_descales).allocator;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)uVar2;
      m_1.elemsize._4_4_ = (undefined4)(uVar2 >> 0x20);
      m_1.c = (this->weight_data_tm_int8_descales).d;
      m_1.d = 1;
      iVar1 = (this->weight_data_tm_int8_descales).dims;
      m_1.dims = iVar1 + -1;
      m_1.cstep = (uVar2 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar2;
      if (iVar1 == 4) {
        m_1.cstep = (long)m_1.h * (long)m_1.w;
      }
      m_2.w = (this->bias_c_data_packed).w;
      m_2.h = (this->bias_c_data_packed).h;
      m_2.c = (this->bias_c_data_packed).d;
      m_2.data = (this->bias_c_data_packed).data;
      m_2.elemsize = (this->bias_c_data_packed).elemsize;
      m_2.elempack = (this->bias_c_data_packed).elempack;
      m_2.allocator = (this->bias_c_data_packed).allocator;
      m_2.refcount = (int *)0x0;
      m_2.d = 1;
      sVar38 = (long)m_2.h * (long)m_2.w;
      iVar1 = (this->bias_c_data_packed).dims;
      m_2.dims = iVar1 + -1;
      m_2.cstep = (m_2.elemsize * sVar38 + 0xf & 0xfffffffffffffff0) / m_2.elemsize;
      if (iVar1 == 4) {
        m_2.cstep = sVar38;
      }
      if ((this->super_LSTM).num_output == (this->super_LSTM).hidden_size) {
        m_3.cstep = 0;
        m_3.data = (void *)0x0;
        m_3.elemsize._0_4_ = 0;
        m_3.elemsize._4_4_ = 0;
        m_3.elempack = 0;
        m_3.allocator = (Allocator *)0x0;
        m_3.dims = 0;
        m_3.w = 0;
        m_3.h = 0;
        m_3.d = 0;
        m_3.c = 0;
      }
      else {
        m_3.w = (this->super_LSTM).weight_hr_data.w;
        m_3.h = (this->super_LSTM).weight_hr_data.h;
        m_3.c = (this->super_LSTM).weight_hr_data.d;
        m_3.data = (this->super_LSTM).weight_hr_data.data;
        uVar2 = (this->super_LSTM).weight_hr_data.elemsize;
        m_3.elempack = (this->super_LSTM).weight_hr_data.elempack;
        m_3.allocator = (this->super_LSTM).weight_hr_data.allocator;
        m_3.elemsize._0_4_ = (undefined4)uVar2;
        m_3.elemsize._4_4_ = (undefined4)(uVar2 >> 0x20);
        m_3.d = 1;
        iVar1 = (this->super_LSTM).weight_hr_data.dims;
        m_3.dims = iVar1 + -1;
        m_3.cstep = (uVar2 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar2;
        if (iVar1 == 4) {
          m_3.cstep = (long)m_3.h * (long)m_3.w;
        }
      }
      m_3.refcount._4_4_ = 0;
      m_3.refcount._0_4_ = 0;
      lstm_int8(&local_318,&local_78,this_00,uVar36,(Mat *)&opt_quant,&m_1,&m_2,&m_3,&local_408,
                &local_458,opt);
      piVar3 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (m_3.allocator == (Allocator *)0x0) {
            if (m_3.data != (void *)0x0) {
              free(m_3.data);
            }
          }
          else {
            (*(m_3.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (m_2.refcount != (int *)0x0) {
        LOCK();
        *m_2.refcount = *m_2.refcount + -1;
        UNLOCK();
        if (*m_2.refcount == 0) {
          if (m_2.allocator == (Allocator *)0x0) {
            if (m_2.data != (void *)0x0) {
              free(m_2.data);
            }
          }
          else {
            (*(m_2.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar3 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            if (m_1.data != (void *)0x0) {
              free(m_1.data);
            }
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar3 = (int *)CONCAT44(opt_quant.blob_allocator._4_4_,opt_quant.blob_allocator._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (opt_quant._32_8_ == 0) {
            if (opt_quant._0_8_ != 0) {
              free((void *)opt_quant._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)opt_quant._32_8_ + 0x18))();
          }
        }
      }
      uVar36 = (this->super_LSTM).direction;
    }
    if (uVar36 == 2) {
      opt_quant.lightmode = false;
      opt_quant.use_shader_pack8 = false;
      opt_quant.use_subgroup_ops = false;
      opt_quant.use_reserved_0 = false;
      opt_quant.num_threads = 0;
      opt_quant.blob_allocator._0_4_ = 0;
      opt_quant.blob_allocator._4_4_ = 0;
      opt_quant.workspace_allocator._0_4_ = 0;
      opt_quant.workspace_allocator._4_4_ = 0;
      opt_quant.openmp_blocktime = 0;
      opt_quant.use_bf16_storage = false;
      opt_quant.use_fp16_packed = false;
      opt_quant.use_fp16_storage = false;
      opt_quant.use_fp16_arithmetic = false;
      opt_quant.use_int8_packed = false;
      opt_quant.use_int8_storage = false;
      opt_quant.use_int8_arithmetic = false;
      opt_quant.use_packing_layout = false;
      opt_quant.vulkan_device_index = 0;
      opt_quant.use_reserved_1 = false;
      opt_quant.use_image_storage = false;
      opt_quant.use_tensor_storage = false;
      opt_quant.use_reserved_2 = false;
      opt_quant.flush_denormals = 0;
      opt_quant.use_local_pool_allocator = false;
      opt_quant.use_shader_local_memory = false;
      opt_quant.use_cooperative_matrix = false;
      opt_quant.use_winograd23_convolution = false;
      opt_quant.use_winograd43_convolution = false;
      opt_quant.use_winograd63_convolution = false;
      opt_quant.use_a53_a55_optimized_kernel = false;
      opt_quant.use_fp16_uniform = false;
      Mat::create((Mat *)&opt_quant,(this->super_LSTM).num_output,_h,4,opt->workspace_allocator);
      piVar3 = (int *)CONCAT44(opt_quant.blob_allocator._4_4_,opt_quant.blob_allocator._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (opt_quant._32_8_ == 0) {
            if (opt_quant._0_8_ != 0) {
              free((void *)opt_quant._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)opt_quant._32_8_ + 0x18))();
          }
        }
      }
      iVar39 = -100;
    }
    else {
      pMVar37 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar39 = 0;
      if ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pMVar37 == 0xd8) {
        if (pMVar37 + 1 != &local_408) {
          piVar3 = (int *)CONCAT44(local_408.refcount._4_4_,local_408.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = pMVar37[1].refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (pMVar37[1].allocator == (Allocator *)0x0) {
                if (pMVar37[1].data != (void *)0x0) {
                  free(pMVar37[1].data);
                }
              }
              else {
                (*(pMVar37[1].allocator)->_vptr_Allocator[3])();
              }
            }
          }
          pMVar37[1].data = local_408.data;
          pMVar37[1].refcount = (int *)CONCAT44(local_408.refcount._4_4_,local_408.refcount._0_4_);
          pMVar37[1].elemsize = CONCAT44(local_408.elemsize._4_4_,(undefined4)local_408.elemsize);
          pMVar37[1].elempack = local_408.elempack;
          pMVar37[1].allocator = local_408.allocator;
          pMVar37[1].dims = local_408.dims;
          pMVar37[1].w = local_408.w;
          pMVar37[1].h = local_408.h;
          pMVar37[1].d = local_408.d;
          pMVar37[1].c = local_408.c;
          pMVar37[1].cstep = local_408.cstep;
          pMVar37 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        }
        iVar39 = 0;
        if (pMVar37 + 2 != &local_458) {
          piVar3 = (int *)CONCAT44(local_458.refcount._4_4_,local_458.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = pMVar37[2].refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (pMVar37[2].allocator == (Allocator *)0x0) {
                if (pMVar37[2].data != (void *)0x0) {
                  free(pMVar37[2].data);
                }
              }
              else {
                (*(pMVar37[2].allocator)->_vptr_Allocator[3])();
              }
            }
          }
          pMVar37[2].data = local_458.data;
          pMVar37[2].refcount = (int *)CONCAT44(local_458.refcount._4_4_,local_458.refcount._0_4_);
          pMVar37[2].elemsize = CONCAT44(local_458.elemsize._4_4_,(undefined4)local_458.elemsize);
          pMVar37[2].elempack = local_458.elempack;
          pMVar37[2].allocator = local_458.allocator;
          pMVar37[2].dims = local_458.dims;
          pMVar37[2].w = local_458.w;
          pMVar37[2].h = local_458.h;
          pMVar37[2].d = local_458.d;
          pMVar37[2].c = local_458.c;
          pMVar37[2].cstep = local_458.cstep;
        }
      }
    }
    piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar3 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_318.allocator == (Allocator *)0x0) {
          if (local_318.data != (void *)0x0) {
            free(local_318.data);
          }
        }
        else {
          (*(local_318.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
LAB_0035e296:
  piVar3 = (int *)CONCAT44(local_458.refcount._4_4_,local_458.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_458.allocator == (Allocator *)0x0) {
        if (local_458.data != (void *)0x0) {
          free(local_458.data);
        }
      }
      else {
        (*(local_458.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_408.refcount._4_4_,local_408.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_408.allocator == (Allocator *)0x0) {
        if (local_408.data != (void *)0x0) {
          free(local_408.data);
        }
      }
      else {
        (*(local_408.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar39;
}

Assistant:

int LSTM_x86::forward_int8(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];

    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(hidden_size, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // dynamic quantize bottom_blob
    Mat bottom_blob_int8;
    Mat bottom_blob_int8_descales;
    {
        Option opt_quant = opt;
        opt_quant.blob_allocator = opt.workspace_allocator;
        opt_quant.use_packing_layout = false;
        lstm_dynamic_quantize(bottom_blob, bottom_blob_int8, bottom_blob_int8_descales, opt_quant);
    }

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        lstm_int8(bottom_blob_int8, bottom_blob_int8_descales, top_blob, direction, weight_data_tm.channel(0), weight_data_tm_int8_descales.channel(0), bias_c_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);
        {
            lstm_int8(bottom_blob_int8, bottom_blob_int8_descales, top_blob_forward, 0, weight_data_tm.channel(0), weight_data_tm_int8_descales.channel(0), bias_c_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden0, cell0, opt);
        }

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);
        {
            lstm_int8(bottom_blob_int8, bottom_blob_int8_descales, top_blob_reverse, 1, weight_data_tm.channel(1), weight_data_tm_int8_descales.channel(1), bias_c_data_packed.channel(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden1, cell1, opt);
        }

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
}